

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repack_script_text_translation.cpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> *
parse_offset_table(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
                  string *string_offsets_raw)

{
  uint uVar1;
  pointer pcVar2;
  pointer puVar3;
  ulong uVar4;
  ulong uVar5;
  
  pcVar2 = (string_offsets_raw->_M_dataplus)._M_p;
  uVar5 = string_offsets_raw->_M_string_length >> 2;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (__return_storage_ptr__,uVar5 & 0xffffffff);
  if ((int)uVar5 != 0) {
    puVar3 = (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      uVar1 = *(uint *)(pcVar2 + uVar4 * 4);
      puVar3[uVar4] =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar4 = uVar4 + 1;
    } while ((uVar5 & 0xffffffff) != uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t>
parse_offset_table(const std::string &string_offsets_raw) {
  // Extract the string offset table
  const uint32_t *string_offsets_u32 =
      reinterpret_cast<const uint32_t *>(string_offsets_raw.data());
  const unsigned string_offset_count =
      string_offsets_raw.size() / sizeof(uint32_t);
  std::vector<uint32_t> string_data_offsets;
  string_data_offsets.resize(string_offset_count);
  for (unsigned i = 0; i < string_offset_count; i++) {
    string_data_offsets[i] = mg::be_to_host_u32(string_offsets_u32[i]);
  }
  return string_data_offsets;
}